

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# C1540.cpp
# Opt level: O3

Cycles __thiscall
Commodore::C1540::MachineBase::perform_bus_operation
          (MachineBase *this,BusOperation operation,uint16_t address,uint8_t *value)

{
  uint8_t uVar1;
  uint __fd;
  undefined6 in_register_00000012;
  void *__buf;
  ssize_t sVar2;
  
  __buf = (void *)CONCAT62(in_register_00000012,address);
  __fd = (uint)__buf;
  if (__fd < 0x800) {
    if (4 < (int)operation) {
      this->ram_[address] = *value;
      goto LAB_00314a9a;
    }
    uVar1 = this->ram_[address];
  }
  else if (address < 0xc000) {
    if ((__fd & 0xfff0) == 0x1c00) {
      if (4 < (int)operation) {
        MOS::MOS6522::MOS6522<Commodore::C1540::DriveVIA>::write
                  (&this->drive_VIA_,__fd,(void *)(ulong)*value,(size_t)value);
        goto LAB_00314a9a;
      }
      sVar2 = MOS::MOS6522::MOS6522<Commodore::C1540::DriveVIA>::read
                        (&this->drive_VIA_,__fd,__buf,(size_t)value);
      uVar1 = (uint8_t)sVar2;
    }
    else {
      if ((__fd & 0xfff0) != 0x1800) goto LAB_00314a9a;
      if (4 < (int)operation) {
        MOS::MOS6522::MOS6522<Commodore::C1540::SerialPortVIA>::write
                  (&this->serial_port_VIA_,__fd,(void *)(ulong)*value,(size_t)value);
        goto LAB_00314a9a;
      }
      sVar2 = MOS::MOS6522::MOS6522<Commodore::C1540::SerialPortVIA>::read
                        (&this->serial_port_VIA_,__fd,__buf,(size_t)value);
      uVar1 = (uint8_t)sVar2;
    }
  }
  else {
    if (4 < (int)operation) goto LAB_00314a9a;
    uVar1 = this->rom_[__fd & 0x3fff];
  }
  *value = uVar1;
LAB_00314a9a:
  MOS::MOS6522::MOS6522<Commodore::C1540::SerialPortVIA>::run_for
            (&this->serial_port_VIA_,(Cycles)0x1);
  MOS::MOS6522::MOS6522<Commodore::C1540::DriveVIA>::run_for(&this->drive_VIA_,(Cycles)0x1);
  return (Cycles)1;
}

Assistant:

Cycles MachineBase::perform_bus_operation(CPU::MOS6502::BusOperation operation, uint16_t address, uint8_t *value) {
	/*
		Memory map (given that I'm unsure yet on any potential mirroring):

			0x0000-0x07ff	RAM
			0x1800-0x180f	the serial-port VIA
			0x1c00-0x1c0f	the drive VIA
			0xc000-0xffff	ROM
	*/
	if(address < 0x800) {
		if(isReadOperation(operation))
			*value = ram_[address];
		else
			ram_[address] = *value;
	} else if(address >= 0xc000) {
		if(isReadOperation(operation)) {
			*value = rom_[address & 0x3fff];
		}
	} else if(address >= 0x1800 && address <= 0x180f) {
		if(isReadOperation(operation))
			*value = serial_port_VIA_.read(address);
		else
			serial_port_VIA_.write(address, *value);
	} else if(address >= 0x1c00 && address <= 0x1c0f) {
		if(isReadOperation(operation))
			*value = drive_VIA_.read(address);
		else
			drive_VIA_.write(address, *value);
	}

	serial_port_VIA_.run_for(Cycles(1));
	drive_VIA_.run_for(Cycles(1));

	return Cycles(1);
}